

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workitems.h
# Opt level: O0

MaterialEvalContext * __thiscall
pbrt::MaterialEvalWorkItem<pbrt::DiffuseTransmissionMaterial>::GetMaterialEvalContext
          (MaterialEvalWorkItem<pbrt::DiffuseTransmissionMaterial> *this,Float dudx,Float dudy,
          Float dvdx,Float dvdy,Normal3f ns,Vector3f dpdus)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  Point3<pbrt::Interval> p;
  long in_RSI;
  MaterialEvalContext *in_RDI;
  Float in_XMM0_Da;
  Float in_XMM1_Da;
  Float in_XMM2_Da;
  Float in_XMM3_Da;
  undefined1 in_XMM4 [16];
  float in_XMM5_Da;
  undefined1 in_XMM6 [16];
  float in_XMM7_Da;
  MaterialEvalContext *ctx;
  MaterialEvalContext *in_stack_ffffffffffffff50;
  Point3<float> *in_stack_ffffffffffffff60;
  MaterialEvalContext *pMVar4;
  undefined8 local_64;
  float local_5c;
  
  uVar1 = vmovlpd_avx(in_XMM4);
  uVar2 = vmovlpd_avx(in_XMM6);
  pMVar4 = in_RDI;
  MaterialEvalContext::MaterialEvalContext(in_stack_ffffffffffffff50);
  uVar3 = *(undefined8 *)(in_RSI + 0xbc);
  (in_RDI->wo).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar3;
  (in_RDI->wo).super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar3 >> 0x20);
  (in_RDI->wo).super_Tuple3<pbrt::Vector3,_float>.z = *(float *)(in_RSI + 0xc4);
  uVar3 = *(undefined8 *)(in_RSI + 0x20);
  (in_RDI->super_TextureEvalContext).n.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar3;
  (in_RDI->super_TextureEvalContext).n.super_Tuple3<pbrt::Normal3,_float>.y =
       (float)(int)((ulong)uVar3 >> 0x20);
  (in_RDI->super_TextureEvalContext).n.super_Tuple3<pbrt::Normal3,_float>.z =
       *(float *)(in_RSI + 0x28);
  (in_RDI->ns).super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar1;
  (in_RDI->ns).super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  (in_RDI->ns).super_Tuple3<pbrt::Normal3,_float>.z = in_XMM5_Da;
  (in_RDI->dpdus).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar2;
  (in_RDI->dpdus).super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar2 >> 0x20);
  (in_RDI->dpdus).super_Tuple3<pbrt::Vector3,_float>.z = in_XMM7_Da;
  p.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y = (Interval)pMVar4;
  p.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x = (Interval)in_RDI;
  p.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z = *(Interval *)(in_RSI + 8);
  Point3<float>::Point3<pbrt::Interval>(in_stack_ffffffffffffff60,p);
  (in_RDI->super_TextureEvalContext).p.super_Tuple3<pbrt::Point3,_float>.x =
       (float)(undefined4)local_64;
  (in_RDI->super_TextureEvalContext).p.super_Tuple3<pbrt::Point3,_float>.y = (float)local_64._4_4_;
  (in_RDI->super_TextureEvalContext).p.super_Tuple3<pbrt::Point3,_float>.z = local_5c;
  (in_RDI->super_TextureEvalContext).uv.super_Tuple2<pbrt::Point2,_float> =
       *(Tuple2<pbrt::Point2,_float> *)(in_RSI + 0x88);
  (in_RDI->super_TextureEvalContext).dudx = in_XMM0_Da;
  (in_RDI->super_TextureEvalContext).dudy = in_XMM1_Da;
  (in_RDI->super_TextureEvalContext).dvdx = in_XMM2_Da;
  (in_RDI->super_TextureEvalContext).dvdy = in_XMM3_Da;
  (in_RDI->super_TextureEvalContext).faceIndex = *(int *)(in_RSI + 0x90);
  return pMVar4;
}

Assistant:

GetMaterialEvalContext(Float dudx, Float dudy, Float dvdx,
                                               Float dvdy, Normal3f ns,
                                               Vector3f dpdus) const {
        MaterialEvalContext ctx;
        ctx.wo = wo;
        ctx.n = n;
        ctx.ns = ns;
        ctx.dpdus = dpdus;
        ctx.p = Point3f(pi);
        ctx.uv = uv;
        ctx.dudx = dudx;
        ctx.dudy = dudy;
        ctx.dvdx = dvdx;
        ctx.dvdy = dvdy;
        ctx.faceIndex = faceIndex;
        return ctx;
    }